

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

void __thiscall test_rope::initialize_tensors(test_rope *this,ggml_context *ctx)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  vector<int,_std::allocator<int>_> data;
  ggml_tensor *in_stack_ffffffffffffffa8;
  allocator_type local_49;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  pointer local_38;
  
  for (piVar3 = (int *)ggml_get_first_tensor(ctx); piVar3 != (int *)0x0;
      piVar3 = (int *)ggml_get_next_tensor(ctx,piVar3)) {
    if (*piVar3 == 0x1a) {
      lVar5 = (this->ne_a)._M_elems[2] << ((byte)this->mode >> 2 & 2);
      uVar4 = (uint)lVar5;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,(long)(int)uVar4,
                 &local_49);
      if ((int)uVar4 < 1) {
        lVar6 = CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
      else {
        uVar7 = 0;
        do {
          iVar2 = rand();
          lVar6 = CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
          *(int *)(lVar6 + uVar7 * 4) = iVar2 % this->n_ctx;
          uVar7 = uVar7 + 1;
        } while ((uVar4 & 0x7fffffff) != uVar7);
      }
      ggml_backend_tensor_set(piVar3,lVar6,0,(lVar5 << 0x20) >> 0x1e);
      pvVar1 = (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_38 - (long)pvVar1);
      }
    }
    else {
      init_tensor_uniform(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                // pos
                const int num_pos_ids = (mode & GGML_ROPE_TYPE_MROPE) ? ne_a[2] * 4 : ne_a[2];
                std::vector<int> data(num_pos_ids);
                for (int i = 0; i < num_pos_ids; i++) {
                    data[i] = rand() % n_ctx;
                }
                ggml_backend_tensor_set(t, data.data(), 0, num_pos_ids * sizeof(int));
            } else {
                if (t->ne[0] == n_dims/2) {
                    // frequency factors in the range [0.9f, 1.1f]
                    init_tensor_uniform(t, 0.9f, 1.1f);
                } else {
                    init_tensor_uniform(t);
                }
            }
        }
    }